

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.h
# Opt level: O0

bool __thiscall ASDCP::MXF::ci_comp::operator()(ci_comp *this,string *a,string *b)

{
  bool bVar1;
  string local_b0;
  string local_90;
  string local_60;
  string local_40;
  string *local_20;
  string *b_local;
  string *a_local;
  ci_comp *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (string *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)a);
  to_lower(&local_40,&local_60);
  std::__cxx11::string::string((string *)&local_b0,(string *)local_20);
  to_lower(&local_90,&local_b0);
  bVar1 = std::operator<(&local_40,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

inline bool operator()(const std::string& a, const std::string& b) const {
	  return to_lower(a) < to_lower(b);
	}